

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_SpawnMissileXYZ
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar6;
  AActor *pAVar7;
  PClassActor *type;
  PClassActor *pPVar8;
  VMValue *pVVar9;
  AActor *dest;
  VMValue *pVVar10;
  char *pcVar11;
  bool bVar12;
  DVector3 local_48;
  PClass *pPVar5;
  undefined4 extraout_var_00;
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar11 = "(paramnum) < numparam";
    goto LAB_0043027d;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00430255:
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0043027d:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1962,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar7 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar7 == (AActor *)0x0) goto LAB_0042ffcf;
    pPVar5 = (pAVar7->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(pAVar7->super_DThinker).super_DObject._vptr_DObject)(pAVar7);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (pAVar7->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar12 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar6 && bVar12) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar12 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar6) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar12) {
      pcVar11 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0043027d;
    }
  }
  else {
    if (pAVar7 != (AActor *)0x0) goto LAB_00430255;
LAB_0042ffcf:
    pAVar7 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar11 = "(paramnum) < numparam";
LAB_004302a5:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1963,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    pcVar11 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_004302a5;
  }
  if (numparam < 3) {
    pcVar11 = "(paramnum) < numparam";
LAB_004302cd:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1964,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar11 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_004302cd;
  }
  if (numparam == 3) {
    pcVar11 = "(paramnum) < numparam";
LAB_004302f5:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1965,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\x01') {
    pcVar11 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_004302f5;
  }
  if ((uint)numparam < 5) {
    pcVar11 = "(paramnum) < numparam";
    goto LAB_00430314;
  }
  if (param[4].field_0.field_3.Type != '\x03') {
LAB_0043025e:
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00430314;
  }
  pvVar1 = param[1].field_0.field_1.a;
  pvVar2 = param[2].field_0.field_1.a;
  pvVar3 = param[3].field_0.field_1.a;
  dest = (AActor *)param[4].field_0.field_1.a;
  if (param[4].field_0.field_1.atag == 1) {
    if (dest == (AActor *)0x0) goto LAB_00430065;
LAB_00430090:
    pPVar5 = AActor::RegistrationInfo.MyClass;
    pPVar6 = (dest->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(dest->super_DThinker).super_DObject._vptr_DObject)(dest);
      pPVar6 = (PClass *)CONCAT44(extraout_var_00,iVar4);
      (dest->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar12 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar5 && bVar12) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar12 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar5) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar12) {
      pcVar11 = "dest == NULL || dest->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_00430314:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1966,
                    "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (dest != (AActor *)0x0) goto LAB_0043025e;
LAB_00430065:
    NullParam("\"dest\"");
    dest = (AActor *)param[4].field_0.field_1.a;
    if (dest != (AActor *)0x0) goto LAB_00430090;
    dest = (AActor *)0x0;
  }
  if (numparam == 5) {
    pcVar11 = "(paramnum) < numparam";
    goto LAB_00430333;
  }
  if (param[5].field_0.field_3.Type != '\x03') {
LAB_0043026a:
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00430333:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1967,
                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[5].field_0.field_1.a;
  if (param[5].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_00430172;
    pPVar8 = type;
    if (type != (PClassActor *)AActor::RegistrationInfo.MyClass) {
      do {
        pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
        if (pPVar8 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
      } while (pPVar8 != (PClassActor *)0x0);
      if (pPVar8 == (PClassActor *)0x0) {
        pcVar11 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_00430333;
      }
    }
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_0043026a;
LAB_00430172:
    type = (PClassActor *)0x0;
  }
  if (numparam < 7) {
    pVVar10 = defaultparam->Array;
    if (pVVar10[6].field_0.field_3.Type != '\0') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_0043037a;
    }
    bVar12 = pVVar10[6].field_0.i != 0;
  }
  else {
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar11 = "(param[paramnum]).Type == REGT_INT";
LAB_0043037a:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1968,
                    "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar12 = param[6].field_0.i != 0;
    if (numparam != 7) {
      if ((param[7].field_0.field_3.Type == '\x03') &&
         ((pVVar9 = param + 7, param[7].field_0.field_1.atag == 1 ||
          ((pVVar9->field_0).field_1.a == (void *)0x0)))) goto LAB_004301f8;
      pcVar11 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_00430399;
    }
    pVVar10 = defaultparam->Array;
  }
  if ((pVVar10[7].field_0.field_3.Type == '\x03') &&
     ((pVVar9 = pVVar10 + 7, pVVar10[7].field_0.field_1.atag == 1 ||
      ((pVVar9->field_0).field_1.a == (void *)0x0)))) {
LAB_004301f8:
    local_48.X = (double)pvVar1;
    local_48.Y = (double)pvVar2;
    local_48.Z = (double)pvVar3;
    pAVar7 = P_SpawnMissileXYZ(&local_48,pAVar7,dest,type,bVar12,
                               (AActor *)(pVVar9->field_0).field_1.a);
    if (numret < 1) {
      iVar4 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x196a,
                      "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar4 = 1;
      VMReturn::SetPointer(ret,pAVar7,1);
    }
    return iVar4;
  }
  pcVar11 = 
  "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
  ;
LAB_00430399:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1969,
                "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnMissileXYZ)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_OBJECT_NOT_NULL(dest, AActor);
	PARAM_CLASS(type, AActor);
	PARAM_BOOL_DEF(check);
	PARAM_OBJECT_DEF(owner, AActor);
	ACTION_RETURN_OBJECT(P_SpawnMissileXYZ(DVector3(x,y,z), self, dest, type, check, owner));
}